

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_draw_plane(rf_vec3 center_pos,rf_vec2 size,rf_color color)

{
  rf_render_batch *prVar1;
  long lVar2;
  rf_vertex_buffer *prVar3;
  rf_mat *prVar4;
  rf_mat left;
  undefined1 auVar5 [40];
  rf_mat mat_scale;
  float local_d8;
  float fStack_d4;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  prVar1 = (rf__ctx->field_0).current_batch;
  lVar2 = prVar1->current_buffer;
  prVar3 = prVar1->vertex_buffers;
  if (prVar3[lVar2].elements_count * 4 <= prVar3[lVar2].v_counter + 4) {
    rf_gfx_draw();
  }
  rf_gfx_push_matrix();
  local_d8 = center_pos.x;
  fStack_d4 = center_pos.y;
  rf_gfx_translatef(local_d8,fStack_d4,center_pos.z);
  prVar4 = (rf__ctx->field_0).current_matrix;
  auVar5 = ZEXT2440(CONCAT816(0x3f80000000000000,CONCAT88(0,(ulong)size & 0xffffffff)));
  left.m10 = (float)(int)((ulong)size >> 0x20);
  left.m14 = (float)(int)(((ulong)size >> 0x20) >> 0x20);
  left.m0 = (float)auVar5._0_4_;
  left.m4 = (float)auVar5._4_4_;
  left.m8 = (float)auVar5._8_4_;
  left.m12 = (float)auVar5._12_4_;
  left.m1 = (float)auVar5._16_4_;
  left.m5 = (float)auVar5._20_4_;
  left.m9 = (float)auVar5._24_4_;
  left.m13 = (float)auVar5._28_4_;
  left.m2 = (float)auVar5._32_4_;
  left.m6 = (float)auVar5._36_4_;
  left.m3 = 0.0;
  left.m7 = 0.0;
  left.m11 = 0.0;
  left.m15 = 1.0;
  rf_mat_mul(left,*prVar4);
  prVar4->m3 = (float)(undefined4)local_40;
  prVar4->m7 = (float)local_40._4_4_;
  prVar4->m11 = (float)(undefined4)uStack_38;
  prVar4->m15 = (float)uStack_38._4_4_;
  prVar4->m2 = (float)(undefined4)local_50;
  prVar4->m6 = (float)local_50._4_4_;
  prVar4->m10 = (float)(undefined4)uStack_48;
  prVar4->m14 = (float)uStack_48._4_4_;
  prVar4->m1 = (float)(undefined4)local_60;
  prVar4->m5 = (float)local_60._4_4_;
  prVar4->m9 = (float)(undefined4)uStack_58;
  prVar4->m13 = (float)uStack_58._4_4_;
  prVar4->m0 = (float)(undefined4)local_70;
  prVar4->m4 = (float)local_70._4_4_;
  prVar4->m8 = (float)(undefined4)uStack_68;
  prVar4->m12 = (float)uStack_68._4_4_;
  rf_gfx_begin(RF_QUADS);
  rf_gfx_color4ub(color.r,color.g,color.b,color.a);
  rf_gfx_vertex3f(-0.5,0.0,-0.5);
  rf_gfx_vertex3f(-0.5,0.0,0.5);
  rf_gfx_vertex3f(0.5,0.0,0.5);
  rf_gfx_vertex3f(0.5,0.0,-0.5);
  rf_gfx_end();
  rf_gfx_pop_matrix();
  return;
}

Assistant:

RF_API void rf_draw_plane(rf_vec3 center_pos, rf_vec2 size, rf_color color)
{
    if (rf_gfx_check_buffer_limit(4)) rf_gfx_draw();

    // NOTE: Plane is always created on XZ ground
    rf_gfx_push_matrix();
    rf_gfx_translatef(center_pos.x, center_pos.y, center_pos.z);
    rf_gfx_scalef(size.x, 1.0f, size.y);

    rf_gfx_begin(RF_QUADS);
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    rf_gfx_normal3f(0.0f, 1.0f, 0.0f);

    rf_gfx_vertex3f(-0.5f, 0.0f, -0.5f);
    rf_gfx_vertex3f(-0.5f, 0.0f, 0.5f);
    rf_gfx_vertex3f(0.5f, 0.0f, 0.5f);
    rf_gfx_vertex3f(0.5f, 0.0f, -0.5f);
    rf_gfx_end();
    rf_gfx_pop_matrix();
}